

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QOpenFolderLineEdit.cpp
# Opt level: O0

void __thiscall
QOpenFolderLineEditPrivate::~QOpenFolderLineEditPrivate(QOpenFolderLineEditPrivate *this)

{
  void *in_RDI;
  
  ~QOpenFolderLineEditPrivate((QOpenFolderLineEditPrivate *)0x21ebe8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class QOpenFolderLineEditPrivate : public QObject {
    Q_OBJECT

public:
    explicit QOpenFolderLineEditPrivate(QOpenFolderLineEdit *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , action(new QFileAction(this)) {
        Q_ASSERT(widget);

        action->setType(QFileAction::Type::OpenFolder);
        widget->addAction(action, position);

        connect(widget, &QLineEdit::textChanged, this, &QOpenFolderLineEditPrivate::textChanged);
        connect(action, &QFileAction::filePathChanged, this, &QOpenFolderLineEditPrivate::filePathChanged);
        connect(action, &QFileAction::filePathChanged, widget, &QOpenFolderLineEdit::filePathChanged);
    }

    void textChanged(const QString &text) {
        action->setFilePath(text);
    }